

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3mixw_io.c
# Opt level: O0

int s3mixw_write(char *fn,float32 ***mixw,uint32 n_mixw,uint32 n_feat,uint32 n_density)

{
  int iVar1;
  int32 iVar2;
  undefined8 in_stack_ffffffffffffff98;
  uint32 *chksum_00;
  undefined4 uVar3;
  uint local_4c;
  uint local_48;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 ignore;
  uint32 chksum;
  FILE *fp;
  uint32 local_28;
  uint32 n_density_local;
  uint32 n_feat_local;
  uint32 n_mixw_local;
  float32 ***mixw_local;
  char *fn_local;
  
  i = 0;
  j = 0;
  fp._4_4_ = n_density;
  local_28 = n_feat;
  n_density_local = n_mixw;
  _n_feat_local = mixw;
  mixw_local = (float32 ***)fn;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  _ignore = s3open((char *)mixw_local,"wb",(uint32 *)0x0);
  if (_ignore == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    for (k = 0; k < n_density_local; k = k + 1) {
      for (local_48 = 0; local_48 < local_28; local_48 = local_48 + 1) {
        for (local_4c = 0; local_4c < fp._4_4_; local_4c = local_4c + 1) {
          if ((float)_n_feat_local[k][local_48][local_4c] <= 0.0 &&
              (float)_n_feat_local[k][local_48][local_4c] != 0.0) {
            in_stack_ffffffffffffff98 =
                 CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),local_4c);
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
                    ,0xcb,"mixw[%u][%u][%u] < 0 (%e)\n",
                    (double)(float)_n_feat_local[k][local_48][local_4c],(ulong)k,(ulong)local_48,
                    in_stack_ffffffffffffff98);
          }
        }
      }
    }
    floor_nz_3d(_n_feat_local,n_density_local,local_28,fp._4_4_,1.2e-38);
    chksum_00 = &i;
    iVar1 = bio_fwrite_3d(_n_feat_local,4,n_density_local,local_28,fp._4_4_,_ignore,chksum_00);
    uVar3 = (undefined4)((ulong)chksum_00 >> 0x20);
    if (iVar1 < 0) {
      s3close(_ignore);
      fn_local._4_4_ = -1;
    }
    else {
      iVar2 = bio_fwrite(&i,4,1,_ignore,0,&j);
      if (iVar2 == 1) {
        s3close(_ignore);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
                ,0xe9,"Wrote %s [%ux%ux%u array]\n",mixw_local,(ulong)n_density_local,
                CONCAT44(uVar3,local_28),fp._4_4_);
        fn_local._4_4_ = 0;
      }
      else {
        s3close(_ignore);
        fn_local._4_4_ = -1;
      }
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3mixw_write(const char *fn,
	     float32 ***mixw,
	     uint32 n_mixw,
	     uint32 n_feat,
	     uint32 n_density)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;
    uint32 i, j, k;

    s3clr_fattr();
    s3add_fattr("version", MIXW_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);

    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    for (i = 0; i < n_mixw; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (mixw[i][j][k] < 0) {
		    E_ERROR("mixw[%u][%u][%u] < 0 (%e)\n",
			    i,j,k,mixw[i][j][k]);
		}
	    }
	}
    }

    /* floor all non-zero entries to this value to make sure
       that results are compatible between machines */
    floor_nz_3d(mixw, n_mixw, n_feat, n_density, MIN_POS_FLOAT32);

    if (bio_fwrite_3d((void ***)mixw,
		   sizeof(float32),
		   n_mixw,
		   n_feat,
		   n_density,
		   fp,
		   &chksum) < 0) {
	s3close(fp);
	return S3_ERROR;
    }
	
    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);

	return S3_ERROR;
    }
	
    s3close(fp);

    E_INFO("Wrote %s [%ux%ux%u array]\n",
	   fn, n_mixw, n_feat, n_density);

    return S3_SUCCESS;
}